

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraExec_cpp.h
# Opt level: O0

void __thiscall
moira::Moira::execBitImEa<(moira::Instr)32,(moira::Mode)0,(moira::Size)1>(Moira *this,u16 opcode)

{
  byte bit;
  u32 uVar1;
  uint uVar2;
  Moira *in_RDI;
  u32 data;
  int dst;
  u8 src;
  u32 in_stack_ffffffffffffffd8;
  int in_stack_ffffffffffffffdc;
  
  uVar1 = readI<(moira::Size)1>(in_RDI);
  bit = (byte)uVar1 & 0x1f;
  uVar1 = readD<(moira::Size)4>(in_RDI,in_stack_ffffffffffffffdc);
  bit<(moira::Instr)32>(in_RDI,uVar1,bit);
  prefetch<4ul>(in_RDI);
  uVar2 = cyclesBit<(moira::Instr)32>(in_RDI,bit);
  (*in_RDI->_vptr_Moira[0x19])(in_RDI,(ulong)uVar2);
  writeD<(moira::Size)4>(in_RDI,in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8);
  return;
}

Assistant:

void
Moira::execBitImEa(u16 opcode)
{
    u8  src = readI<S>();
    int dst = _____________xxx(opcode);

    switch (M)
    {
        case 0:
        {
            src &= 0b11111;
            u32 data = readD(dst);
            data = bit<I>(data, src);

            prefetch<POLLIPL>();

            sync(cyclesBit<I>(src));
            if (I != BTST) writeD(dst, data);
            break;
        }
        default:
        {
            src &= 0b111;
            u32 ea, data;
            if (!readOp<M,S>(dst, ea, data)) return;

            data = bit<I>(data, src);

            if (I != BTST) {
                prefetch();
                writeM <M, S, POLLIPL> (ea, data);
            } else {
                prefetch<POLLIPL>();
            }
        }
    }
}